

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsObjectHasProperty(JsValueRef object,JsValueRef propertyId,bool *hasProperty)

{
  code *pcVar1;
  anon_class_24_3_2776ca25 fn;
  anon_class_24_3_2776ca25 fn_00;
  anon_class_24_3_2776ca25 fn_01;
  bool bVar2;
  BOOL BVar3;
  JsErrorCode JVar4;
  undefined4 *puVar5;
  bool **in_stack_ffffffffffffff30;
  CustomExternalWrapperObject *pCVar6;
  CustomExternalWrapperObject *externalWrapper;
  TypeId local_6c;
  RecyclableObject *pRStack_68;
  TypeId typeId;
  RecyclableObject *robject;
  anon_class_24_3_2776ca25 internalHasProperty;
  bool *hasProperty_local;
  JsValueRef propertyId_local;
  JsValueRef object_local;
  RecyclableObject *pRStack_28;
  TypeId typeId_2;
  TypeId local_1c;
  RecyclableObject *pRStack_18;
  TypeId typeId_1;
  JsValueRef local_10;
  
  if (object == (JsValueRef)0x0) {
    object_local._0_4_ = JsErrorInvalidArgument;
  }
  else {
    internalHasProperty.hasProperty = (bool **)hasProperty;
    hasProperty_local = (bool *)propertyId;
    propertyId_local = object;
    BVar3 = Js::JavascriptOperators::IsObject(object);
    if (BVar3 == 0) {
      object_local._0_4_ = JsErrorArgumentNotObject;
    }
    else {
      internalHasProperty.object = &hasProperty_local;
      internalHasProperty.propertyId = &internalHasProperty.hasProperty;
      pRStack_68 = Js::VarTo<Js::RecyclableObject>(propertyId_local);
      pRStack_18 = pRStack_68;
      if (pRStack_68 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_1c = Js::RecyclableObject::GetTypeId(pRStack_18);
      if ((0x57 < (int)local_1c) &&
         (BVar3 = Js::RecyclableObject::IsExternal(pRStack_18), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_6c = local_1c;
      while (local_6c != TypeIds_Null && local_6c != TypeIds_Proxy) {
        pRStack_68 = Js::RecyclableObject::GetPrototype(pRStack_68);
        pRStack_28 = pRStack_68;
        if (pRStack_68 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        object_local._4_4_ = Js::RecyclableObject::GetTypeId(pRStack_28);
        if ((0x57 < (int)object_local._4_4_) &&
           (BVar3 = Js::RecyclableObject::IsExternal(pRStack_28), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        local_6c = object_local._4_4_;
      }
      if (local_6c == TypeIds_Proxy) {
        fn_00.propertyId = internalHasProperty.propertyId;
        fn_00.object = internalHasProperty.object;
        fn_00.hasProperty = in_stack_ffffffffffffff30;
        object_local._0_4_ = ContextAPIWrapper<false,JsObjectHasProperty::__0>(fn_00);
      }
      else {
        if (local_6c == TypeIds_Object) {
          local_10 = propertyId_local;
          bVar2 = Js::VarIs<Js::CustomExternalWrapperObject>(propertyId_local);
          if (bVar2) {
            pCVar6 = Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(local_10);
          }
          else {
            pCVar6 = (CustomExternalWrapperObject *)0x0;
          }
          if (pCVar6 != (CustomExternalWrapperObject *)0x0) {
            fn_01.propertyId = internalHasProperty.propertyId;
            fn_01.object = internalHasProperty.object;
            fn_01.hasProperty = (bool **)pCVar6;
            JVar4 = ContextAPIWrapper<false,JsObjectHasProperty::__0>(fn_01);
            return JVar4;
          }
        }
        fn.propertyId = internalHasProperty.object;
        fn.object = &propertyId_local;
        fn.hasProperty = (bool **)internalHasProperty.propertyId;
        object_local._0_4_ = ContextAPINoScriptWrapper<JsObjectHasProperty::__0>(fn,false,false);
      }
    }
  }
  return (JsErrorCode)object_local;
}

Assistant:

CHAKRA_API JsObjectHasProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId, _Out_ bool *hasProperty)
{
    VALIDATE_JSREF(object);
    if (!Js::JavascriptOperators::IsObject(object)) return JsErrorArgumentNotObject;

    auto internalHasProperty = [&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);
        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(hasProperty);
        *hasProperty = false;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Js::RecyclableObject * instance = Js::VarTo<Js::RecyclableObject>(object);
        *hasProperty = Js::JavascriptOperators::HasProperty(instance, propertyRecord->GetPropertyId()) != 0;

        return JsNoError;
    };

    Js::RecyclableObject* robject = Js::VarTo<Js::RecyclableObject>(object);
    Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(robject);
    while (typeId != Js::TypeIds_Null && typeId != Js::TypeIds_Proxy)
    {
        robject = robject->GetPrototype();
        typeId = Js::JavascriptOperators::GetTypeId(robject);
    }

    if (typeId == Js::TypeIds_Proxy)
    {
        return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
    }
    else if (typeId == Js::TypeIds_Object)
    {
        // CEOs can also have traps so we would want the Enter/Leave semantics for those.
        Js::CustomExternalWrapperObject * externalWrapper = Js::JavascriptOperators::TryFromVar<Js::CustomExternalWrapperObject>(object);
        if (externalWrapper)
        {
            return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
        }
    }

    return ContextAPINoScriptWrapper(internalHasProperty);
}